

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

bool __thiscall wallet::CWallet::TopUpKeyPool(CWallet *this,uint kpSize)

{
  byte bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock53;
  unique_lock<std::recursive_mutex> local_68;
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_68._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_68);
  GetActiveScriptPubKeyMans
            ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              *)&local_58,this);
  bVar2 = true;
  for (; (_Rb_tree_header *)local_58._M_impl.super__Rb_tree_header._M_header._M_left !=
         &local_58._M_impl.super__Rb_tree_header;
      local_58._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::_Rb_tree_increment
                     ((_Rb_tree_node_base *)local_58._M_impl.super__Rb_tree_header._M_header._M_left
                     )) {
    bVar1 = (**(code **)(**(long **)(local_58._M_impl.super__Rb_tree_header._M_header._M_left + 1) +
                        0x48))(*(long **)(local_58._M_impl.super__Rb_tree_header._M_header._M_left +
                                         1),kpSize);
    bVar2 = (bool)(bVar2 & bVar1);
  }
  std::
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::~_Rb_tree(&local_58);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool CWallet::TopUpKeyPool(unsigned int kpSize)
{
    LOCK(cs_wallet);
    bool res = true;
    for (auto spk_man : GetActiveScriptPubKeyMans()) {
        res &= spk_man->TopUp(kpSize);
    }
    return res;
}